

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_refs.cpp
# Opt level: O3

MPP_RET mpp_enc_refs_get_cpb_pass1(MppEncRefs refs,EncCpbStatus *status)

{
  EncVirtualCpb *cpb;
  EncFrmStatus *frm;
  EncFrmStatus *frm_00;
  RK_S32 RVar1;
  undefined8 in_RAX;
  EncFrmStatus *frm_01;
  EncFrmStatus EVar2;
  MPP_RET MVar3;
  undefined4 uVar4;
  
  uVar4 = (undefined4)((ulong)in_RAX >> 0x20);
  if (refs == (MppEncRefs)0x0) {
    _mpp_log_l(2,"mpp_enc_refs","invalid NULL input refs\n","mpp_enc_refs_get_cpb_pass1");
    MVar3 = MPP_ERR_VALUE;
  }
  else {
    if (((byte)enc_refs_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_enc_refs","enter %p\n","mpp_enc_refs_get_cpb_pass1",refs);
    }
    cpb = (EncVirtualCpb *)((long)refs + 0x40);
    frm = &status->curr;
    frm_00 = &status->refr;
    (status->curr).val = (status->curr).val & 0xffffffffc0000f38 | 0x45;
    frm_01 = get_ref_from_cpb(cpb,frm);
    if (frm_01 == (EncFrmStatus *)0x0) {
      EVar2.val = 0;
    }
    else {
      RVar1 = check_ref_cpb_pos(cpb,frm_01);
      if (RVar1 < 0) {
        _mpp_log_l(2,"mpp_enc_refs","Assertion %s failed at %s:%d\n",(char *)0x0,"cpb_idx >= 0",
                   "mpp_enc_refs_get_cpb_pass1",CONCAT44(uVar4,0x403));
        if ((mpp_debug._3_1_ & 0x10) != 0) {
          abort();
        }
      }
      *(EncFrmStatus *)((long)refs + 0x5a0) = *frm_00;
      EVar2 = *frm_01;
    }
    *frm_00 = EVar2;
    if (((byte)enc_refs_debug & 4) != 0) {
      _mpp_log_l(4,"mpp_enc_refs","frm status:\n","mpp_enc_refs_get_cpb_pass1");
      _dump_frm(frm,"mpp_enc_refs_get_cpb_pass1",0x40b);
      _mpp_log_l(4,"mpp_enc_refs","ref status:\n","mpp_enc_refs_get_cpb_pass1");
      _dump_frm(frm_00,"mpp_enc_refs_get_cpb_pass1",0x40d);
    }
    status->init[6].val = 0;
    status->init[7].val = 0;
    status->init[4].val = 0;
    status->init[5].val = 0;
    status->init[2].val = 0;
    status->init[3].val = 0;
    status->init[0].val = 0;
    status->init[1].val = 0;
    save_cpb_status(cpb,status->init);
    store_ref_to_cpb(cpb,frm);
    status->final[6].val = 0;
    status->final[7].val = 0;
    status->final[4].val = 0;
    status->final[5].val = 0;
    status->final[2].val = 0;
    status->final[3].val = 0;
    status->final[0].val = 0;
    status->final[1].val = 0;
    save_cpb_status(cpb,status->final);
    MVar3 = MPP_OK;
    if (((byte)enc_refs_debug & 1) != 0) {
      MVar3 = MPP_OK;
      _mpp_log_l(4,"mpp_enc_refs","leave %p\n","mpp_enc_refs_get_cpb_pass1",refs);
    }
  }
  return MVar3;
}

Assistant:

MPP_RET mpp_enc_refs_get_cpb_pass1(MppEncRefs refs, EncCpbStatus *status)
{
    if (NULL == refs) {
        mpp_err_f("invalid NULL input refs\n");
        return MPP_ERR_VALUE;
    }

    enc_refs_dbg_func("enter %p\n", refs);

    MppEncRefsImpl *p = (MppEncRefsImpl *)refs;
    EncVirtualCpb *cpb = &p->cpb;
    EncFrmStatus *frm = &status->curr;
    EncFrmStatus *ref = &status->refr;

    frm->valid = 1;
    frm->save_pass1 = 1;
    frm->is_non_ref = 1;
    frm->is_lt_ref = 0;
    frm->temporal_id = 0;
    frm->ref_mode = REF_TO_PREV_REF_FRM;
    frm->ref_arg = 0;
    frm->non_recn = 0;

    /* step 4. try find ref by the ref_mode */
    EncFrmStatus *ref_found = get_ref_from_cpb(cpb, frm);
    if (ref_found) {
        RK_S32 cpb_idx = check_ref_cpb_pos(cpb, ref_found);

        mpp_assert(cpb_idx >= 0);
        cpb->list0[0].val = ref->val;
        ref->val = ref_found->val;
    } else
        ref->val = 0;

    if (enc_refs_debug & MPP_ENC_REFS_DBG_FRM) {
        mpp_log_f("frm status:\n");
        dump_frm(frm);
        mpp_log_f("ref status:\n");
        dump_frm(ref);
    }

    /* step 5. generate cpb init */
    memset(status->init, 0, sizeof(status->init));
    save_cpb_status(cpb, status->init);
    // TODO: cpb_init must be the same to cpb_final

    /* step 6. store frame according to status */
    store_ref_to_cpb(cpb, frm);

    /* step 7. generate cpb final */
    memset(status->final, 0, sizeof(status->final));
    save_cpb_status(cpb, status->final);

    enc_refs_dbg_func("leave %p\n", refs);
    return MPP_OK;
}